

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

int * GetCodepoints(char *text,int *count)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int bytesProcessed;
  int local_3c;
  int *local_38;
  
  piVar6 = GetCodepoints::codepoints;
  iVar4 = 0;
  local_38 = count;
  memset(GetCodepoints::codepoints,0,0x800);
  local_3c = 0;
  lVar5 = 0;
  if ((text != (char *)0x0) && (lVar5 = 0, *text != '\0')) {
    lVar5 = 0;
    do {
      lVar1 = lVar5 + 1;
      lVar5 = lVar5 + 1;
    } while (text[lVar1] != '\0');
  }
  if (0 < (int)lVar5) {
    iVar4 = 0;
    iVar3 = 0;
    do {
      iVar2 = GetNextCodepoint(text + iVar3,&local_3c);
      iVar3 = iVar3 + local_3c;
      *piVar6 = iVar2;
      piVar6 = piVar6 + 1;
      iVar4 = iVar4 + 1;
    } while (iVar3 < (int)lVar5);
  }
  *local_38 = iVar4;
  return GetCodepoints::codepoints;
}

Assistant:

int *GetCodepoints(const char *text, int *count)
{
    static int codepoints[MAX_TEXT_UNICODE_CHARS] = { 0 };
    memset(codepoints, 0, MAX_TEXT_UNICODE_CHARS*sizeof(int));

    int bytesProcessed = 0;
    int textLength = TextLength(text);
    int codepointsCount = 0;

    for (int i = 0; i < textLength; codepointsCount++)
    {
        codepoints[codepointsCount] = GetNextCodepoint(text + i, &bytesProcessed);
        i += bytesProcessed;
    }

    *count = codepointsCount;

    return codepoints;
}